

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Performance::TextureUploadCase::init(TextureUploadCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  int iVar1;
  int extraout_EAX;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 extraout_var;
  ShaderProgram *pSVar5;
  TestError *this_00;
  uint rowPitch;
  TextureFormat local_168;
  int maxTextureSize;
  string fragmentShaderSource;
  string vertexShaderSource;
  Vec4 local_118;
  Vec4 local_108;
  PixelBufferAccess access;
  long lVar4;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x868))(0xd33,&maxTextureSize);
  if (maxTextureSize < this->m_texSize) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Unsupported texture size");
    iVar1 = extraout_EAX;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vertexShaderSource,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&access);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fragmentShaderSource,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&access);
    std::__cxx11::string::append((char *)&vertexShaderSource);
    std::__cxx11::string::append((char *)&fragmentShaderSource);
    pSVar5 = (ShaderProgram *)operator_new(0xd0);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    glu::makeVtxFragSources((ProgramSources *)&access,&vertexShaderSource,&fragmentShaderSource);
    glu::ShaderProgram::ShaderProgram(pSVar5,renderCtx,(ProgramSources *)&access);
    this->m_program = pSVar5;
    glu::ProgramSources::~ProgramSources((ProgramSources *)&access);
    pSVar5 = this->m_program;
    if ((pSVar5->m_program).m_info.linkOk == false) {
      glu::operator<<(this->m_log,pSVar5);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Failed to create shader program (m_programRender)",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pTextureUploadTests.cpp"
                 ,0xb6);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar4 + 0x1680))((pSVar5->m_program).m_program);
    (**(code **)(lVar4 + 0x1a00))(0,0,0x40);
    (**(code **)(lVar4 + 0x4e8))(0xb71);
    (**(code **)(lVar4 + 0x4e8))(0xb44);
    (**(code **)(lVar4 + 0x5e0))(0xbe2);
    (**(code **)(lVar4 + 0x120))(1,1);
    (**(code **)(lVar4 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar4 + 0x188))(0x4000);
    uVar2 = (**(code **)(lVar4 + 0xb48))((this->m_program->m_program).m_program,"u_sampler");
    uVar3 = (**(code **)(lVar4 + 0x780))((this->m_program->m_program).m_program,"a_pos");
    (**(code **)(lVar4 + 0x610))(uVar3);
    (**(code **)(lVar4 + 0x19f0))(uVar3,2,0x1406,0,0,quadCoords);
    (**(code **)(lVar4 + 0x14f0))(uVar2,0);
    (**(code **)(lVar4 + 8))(0x84c0);
    (**(code **)(lVar4 + 0x6f8))(1,&this->m_texture);
    (**(code **)(lVar4 + 0xb8))(0xde1,this->m_texture);
    (**(code **)(lVar4 + 0xff0))(0xcf5,this->m_alignment);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2802,0x812f);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2803,0x812f);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2801,0x2601);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2800,0x2601);
    local_168 = glu::mapGLTransferFormat(this->m_format,this->m_type);
    iVar1 = tcu::TextureFormat::getPixelSize(&local_168);
    rowPitch = -this->m_alignment & (iVar1 * this->m_texSize + this->m_alignment) - 1U;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_texData,(long)(int)(this->m_texSize * rowPitch));
    tcu::PixelBufferAccess::PixelBufferAccess
              (&access,&local_168,this->m_texSize,this->m_texSize,1,rowPitch,0,
               (this->m_texData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
    local_108.m_data[0] = 0.0;
    local_108.m_data[1] = 0.0;
    local_108.m_data[2] = 0.0;
    local_108.m_data[3] = 0.0;
    local_118.m_data[0] = 1.0;
    local_118.m_data[1] = 1.0;
    local_118.m_data[2] = 1.0;
    local_118.m_data[3] = 1.0;
    tcu::fillWithComponentGradients(&access,&local_108,&local_118);
    (**(code **)(lVar4 + 0x1310))
              (0xde1,0,this->m_format,this->m_texSize,this->m_texSize,0,this->m_format,this->m_type,
               (this->m_texData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
    (**(code **)(lVar4 + 0x538))(5,0,4);
    (**(code **)(lVar4 + 0x648))();
    std::__cxx11::string::~string((string *)&fragmentShaderSource);
    iVar1 = std::__cxx11::string::~string((string *)&vertexShaderSource);
  }
  return iVar1;
}

Assistant:

void TextureUploadCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	int maxTextureSize;
	gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);

	if (m_texSize > maxTextureSize)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Unsupported texture size");
		return;
	}

	// Create program

	string vertexShaderSource = "";
	string fragmentShaderSource = "";

	vertexShaderSource.append(	"precision mediump	float;\n"
								"attribute vec2		a_pos;\n"
								"varying   vec2		v_texCoord;\n"
								"\n"
								"void main (void)\n"
								"{\n"
								"	v_texCoord	= a_pos;\n"
								"	gl_Position = vec4(a_pos, 0.5, 1.0);\n"
								"}\n");

	fragmentShaderSource.append("precision	mediump	float;\n"
								"uniform	lowp sampler2D	u_sampler;\n"
								"varying	vec2			v_texCoord;\n"
								"\n"
								"void main (void)\n"
								"{\n"
								"	gl_FragColor = texture2D(u_sampler, v_texCoord.xy);\n"
								"}\n");

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));

	if (!m_program->isOk())
	{
		m_log << *m_program;
		TCU_FAIL("Failed to create shader program (m_programRender)");
	}

	gl.useProgram (m_program->getProgram());

	// Init GL state

	gl.viewport		(0, 0, VIEWPORT_SIZE, VIEWPORT_SIZE);
	gl.disable		(GL_DEPTH_TEST);
	gl.disable		(GL_CULL_FACE);
	gl.enable		(GL_BLEND);
	gl.blendFunc	(GL_ONE, GL_ONE);
	gl.clearColor	(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear		(GL_COLOR_BUFFER_BIT);

	deUint32 uSampler	= gl.getUniformLocation(m_program->getProgram(), "u_sampler");
	deUint32 aPos		= gl.getAttribLocation (m_program->getProgram(), "a_pos");
	gl.enableVertexAttribArray	(aPos);
	gl.vertexAttribPointer		(aPos,	2, GL_FLOAT, GL_FALSE, 0, &quadCoords[0]);
	gl.uniform1i				(uSampler, 0);

	// Create texture

	gl.activeTexture	(GL_TEXTURE0);
	gl.genTextures		(1, &m_texture);
	gl.bindTexture		(GL_TEXTURE_2D, m_texture);
	gl.pixelStorei		(GL_UNPACK_ALIGNMENT, m_alignment);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

	// Prepare texture data

	{
		const tcu::TextureFormat&	texFmt		= glu::mapGLTransferFormat(m_format, m_type);
		int							pixelSize	= texFmt.getPixelSize();
		int							stride		= deAlign32(pixelSize*m_texSize, m_alignment);

		m_texData.resize(stride*m_texSize);

		tcu::PixelBufferAccess		access		(texFmt, m_texSize, m_texSize, 1, stride, 0, &m_texData[0]);

		tcu::fillWithComponentGradients(access, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	}

	// Do a dry-run to ensure the pipes are hot

	gl.texImage2D	(GL_TEXTURE_2D, 0, m_format, m_texSize, m_texSize, 0, m_format, m_type, &m_texData[0]);
	gl.drawArrays	(GL_TRIANGLE_STRIP, 0, 4);
	gl.finish		();
}